

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deco.h
# Opt level: O0

Dec_Node_t * Dec_GraphAppendNode(Dec_Graph_t *pGraph)

{
  int iVar1;
  Dec_Node_t *pDVar2;
  Dec_Node_t *local_20;
  Dec_Node_t *pNode;
  Dec_Graph_t *pGraph_local;
  
  if (pGraph->nSize == pGraph->nCap) {
    if (pGraph->pNodes == (Dec_Node_t *)0x0) {
      local_20 = (Dec_Node_t *)malloc((long)(pGraph->nCap << 1) * 0x18);
    }
    else {
      local_20 = (Dec_Node_t *)realloc(pGraph->pNodes,(long)(pGraph->nCap << 1) * 0x18);
    }
    pGraph->pNodes = local_20;
    pGraph->nCap = pGraph->nCap << 1;
  }
  pDVar2 = pGraph->pNodes;
  iVar1 = pGraph->nSize;
  pGraph->nSize = iVar1 + 1;
  memset(pDVar2 + iVar1,0,0x18);
  return pDVar2 + iVar1;
}

Assistant:

static inline Dec_Node_t * Dec_GraphAppendNode( Dec_Graph_t * pGraph )   
{
    Dec_Node_t * pNode;
    if ( pGraph->nSize == pGraph->nCap )
    {
        pGraph->pNodes = ABC_REALLOC( Dec_Node_t, pGraph->pNodes, 2 * pGraph->nCap ); 
        pGraph->nCap   = 2 * pGraph->nCap;
    }
    pNode = pGraph->pNodes + pGraph->nSize++;
    memset( pNode, 0, sizeof(Dec_Node_t) );
    return pNode;
}